

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O0

QString * Mustache::Renderer::readTagName
                    (QString *__return_storage_ptr__,QString *content,int pos,int endPos)

{
  bool bVar1;
  QChar c;
  QChar local_38;
  QChar local_36 [10];
  undefined1 local_21;
  int local_20;
  int local_1c;
  int endPos_local;
  int pos_local;
  QString *content_local;
  QString *name;
  
  local_21 = 0;
  local_20 = endPos;
  local_1c = pos;
  _endPos_local = content;
  content_local = __return_storage_ptr__;
  QString::QString(__return_storage_ptr__);
  QString::reserve(__return_storage_ptr__,(long)(local_20 - local_1c));
  while( true ) {
    local_36[0] = QString::at(_endPos_local,(long)local_1c);
    bVar1 = QChar::isSpace(local_36);
    if (!bVar1) break;
    local_1c = local_1c + 1;
  }
  while( true ) {
    local_38 = QString::at(_endPos_local,(long)local_1c);
    bVar1 = QChar::isSpace(&local_38);
    if (bVar1 || local_20 <= local_1c) break;
    c = QString::at(_endPos_local,(long)local_1c);
    QString::operator+=(__return_storage_ptr__,c);
    local_1c = local_1c + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

QString Renderer::readTagName(const QString& content, int pos, int endPos)
{
	QString name;
	name.reserve(endPos - pos);
	while (content.at(pos).isSpace()) {
		++pos;
	}
	while (!content.at(pos).isSpace() && pos < endPos) {
		name += content.at(pos);
		++pos;
	}
	return name;
}